

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O2

void __thiscall Peeps::ClearReg(Peeps *this,RegNum reg)

{
  StackSym *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  undefined7 in_register_00000031;
  ulong uVar5;
  
  uVar5 = CONCAT71(in_register_00000031,reg) & 0xffffffff;
  pSVar1 = this->regMap[uVar5];
  if (pSVar1 != (StackSym *)0x0) {
    if ((pSVar1->scratch).peeps.reg != reg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                         ,0x1a2,"(sym->scratch.peeps.reg == reg)","Something is wrong here...");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    (pSVar1->scratch).peeps.reg = RegNOREG;
    this->regMap[uVar5] = (StackSym *)0x0;
  }
  return;
}

Assistant:

void
Peeps::ClearReg(RegNum reg)
{
    StackSym *sym = this->regMap[reg];

    if (sym)
    {
        AssertMsg(sym->scratch.peeps.reg == reg, "Something is wrong here...");
        sym->scratch.peeps.reg = RegNOREG;
        this->regMap[reg] = NULL;
    }
}